

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::StandardBufferManager::AllocateMemory
          (StandardBufferManager *this,MemoryTag tag,BlockManager *block_manager,bool can_destroy)

{
  idx_t block_header_size;
  idx_t iVar1;
  undefined7 in_register_00000009;
  shared_ptr<duckdb::BlockHandle,_true> sVar2;
  
  block_header_size =
       BlockManager::GetBlockSize((BlockManager *)CONCAT71(in_register_00000009,can_destroy));
  iVar1 = BlockManager::GetBlockHeaderSize
                    ((BlockManager *)CONCAT71(in_register_00000009,can_destroy));
  sVar2 = RegisterMemory(this,tag,(ulong)block_manager & 0xffffffff,block_header_size,SUB81(iVar1,0)
                        );
  sVar2.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar2.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> StandardBufferManager::AllocateMemory(MemoryTag tag, BlockManager *block_manager,
                                                              bool can_destroy) {
	return RegisterMemory(tag, block_manager->GetBlockSize(), block_manager->GetBlockHeaderSize(), can_destroy);
}